

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::
       MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1024>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar8;
  ParseContext *extraout_RDX;
  ParseContext *ctx_00;
  RepeatedField<unsigned_int> *this;
  char *pcVar9;
  char *pcVar10;
  uint *puVar11;
  ulong uVar12;
  uint uVar13;
  char *unaff_R14;
  byte *p;
  bool bVar14;
  pair<const_char_*,_unsigned_int> pVar15;
  
  puVar11 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar11 & 3) == 0) {
    this = (RepeatedField<unsigned_int> *)((long)&msg->_vptr_MessageLite + (ulong)*puVar11);
    if (((ulong)this & 7) != 0) {
      AlignFail(this);
    }
    aVar8.data = (long)&table->has_bits_offset + (ulong)table->aux_offset;
    puVar11 = *(uint **)(aVar8.data + (ulong)(ushort)puVar11[2] * 8);
    ctx_00 = ctx;
    do {
      pcVar9 = (char *)(long)*ptr;
      if ((long)pcVar9 < 0) {
        uVar12 = (long)(char)((byte *)ptr)[1] << 7 | 0x7f;
        if ((long)uVar12 < 0) {
          aVar8.data = (long)(char)((byte *)ptr)[2] << 0xe | 0x3fff;
          if ((long)aVar8 < 0) {
            ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[3] << 0x15 | 0x1fffff);
            uVar12 = uVar12 & (ulong)ctx_00;
            if ((long)uVar12 < 0) {
              ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[4] << 0x1c | 0xfffffff);
              aVar8.data = aVar8.data & (ulong)ctx_00;
              if ((long)aVar8.data < 0) {
                ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[5] << 0x23 | 0x7ffffffff);
                uVar12 = uVar12 & (ulong)ctx_00;
                if ((long)uVar12 < 0) {
                  ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[6] << 0x2a | 0x3ffffffffff);
                  aVar8.data = aVar8.data & (ulong)ctx_00;
                  if ((long)aVar8 < 0) {
                    ctx_00 = (ParseContext *)
                             ((long)(char)((byte *)ptr)[7] << 0x31 | 0x1ffffffffffff);
                    uVar12 = uVar12 & (ulong)ctx_00;
                    if ((long)uVar12 < 0) {
                      ctx_00 = (ParseContext *)((ulong)((byte *)ptr)[8] << 0x38 | 0xffffffffffffff);
                      aVar8.data = aVar8.data & (ulong)ctx_00;
                      if ((long)aVar8 < 0) {
                        p = (byte *)ptr + 10;
                        if (((byte *)ptr)[9] != 1) {
                          bVar1 = ((byte *)ptr)[9];
                          ctx_00 = (ParseContext *)CONCAT71((int7)((ulong)ctx_00 >> 8),bVar1);
                          if ((char)bVar1 < '\0') {
                            p = (byte *)0x0;
                            goto LAB_0015be22;
                          }
                          if ((bVar1 & 1) == 0) {
                            aVar8.data = aVar8.data ^ 0x8000000000000000;
                          }
                        }
                      }
                      else {
                        p = (byte *)ptr + 9;
                      }
                    }
                    else {
                      p = (byte *)ptr + 8;
                    }
                  }
                  else {
                    p = (byte *)ptr + 7;
                  }
                }
                else {
                  p = (byte *)ptr + 6;
                }
              }
              else {
                p = (byte *)ptr + 5;
              }
            }
            else {
              p = (byte *)ptr + 4;
            }
          }
          else {
            p = (byte *)ptr + 3;
          }
          uVar12 = uVar12 & aVar8.data;
        }
        else {
          p = (byte *)ptr + 2;
        }
        pcVar9 = (char *)((ulong)pcVar9 & uVar12);
      }
      else {
        p = (byte *)ptr + 1;
      }
LAB_0015be22:
      if (p == (byte *)0x0) {
        iVar6 = 4;
      }
      else {
        uVar12 = (ulong)(*puVar11 >> 0x10);
        uVar13 = (uint)pcVar9;
        uVar7 = (long)(int)uVar13 - (long)(short)*puVar11;
        aVar8.data = uVar7 - uVar12;
        if (uVar12 <= uVar7) {
          uVar3 = puVar11[1];
          if ((ulong)aVar8 < (ulong)(uVar3 & 0xffff)) {
            bVar14 = (puVar11[(aVar8.data >> 5) + 2] >> ((uint)aVar8.data & 0x1f) & 1) != 0;
LAB_0015bf3c:
            if (!bVar14) {
              pcVar9 = MpUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
              return pcVar9;
            }
          }
          else {
            aVar8._0_4_ = uVar3 >> 0x10;
            aVar8.data._4_4_ = 0;
            uVar12 = 0;
            do {
              bVar14 = uVar12 < aVar8.data;
              if (!bVar14) goto LAB_0015bf3c;
              uVar4 = *(uint *)((long)puVar11 + uVar12 * 4 + (ulong)(uVar3 >> 3 & 0x1ffc) + 8);
              uVar12 = (uVar12 * 2 - (ulong)((int)uVar13 < (int)uVar4)) + 2;
            } while (uVar4 != uVar13);
          }
        }
        RepeatedField<unsigned_int>::Add(this,uVar13);
        pVar15._8_8_ = extraout_RDX;
        pVar15.first = (char *)ctx;
        if (p < (ctx->super_EpsCopyInputStream).limit_end_) {
          bVar1 = *p;
          ptr = (char *)(p + 1);
          unaff_R14 = (char *)(ulong)bVar1;
          if ((char)bVar1 < '\0') {
            bVar2 = *ptr;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = extraout_RDX;
            pVar15 = (pair<const_char_*,_unsigned_int>)(auVar5 << 0x40);
            aVar8.data = (ulong)bVar2 << 7;
            uVar13 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            pcVar10 = (char *)(ulong)uVar13;
            if ((char)bVar2 < '\0') {
              pVar15 = ReadTagFallback((char *)p,uVar13);
              ptr = pVar15.first;
              unaff_R14 = (char *)(ulong)pVar15.second;
              pcVar9 = pcVar10;
            }
            else {
              ptr = (char *)(p + 2);
              unaff_R14 = pcVar10;
            }
          }
          ctx_00 = pVar15._8_8_;
          iVar6 = (uint)((byte *)ptr == (byte *)0x0) << 2;
        }
        else {
          iVar6 = 5;
          ctx_00 = extraout_RDX;
        }
      }
      if (iVar6 != 0) {
        if (iVar6 == 4) {
          pcVar9 = Error(msg,pcVar9,ctx_00,(TcFieldData)aVar8,table,hasbits);
          return pcVar9;
        }
        break;
      }
    } while ((int)unaff_R14 == data.field_0._0_4_);
    if ((ulong)table->has_bits_offset != 0) {
      puVar11 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar11 & 3) != 0) goto LAB_0015c092;
      *puVar11 = *puVar11 | (uint)hasbits;
    }
    return (char *)p;
  }
LAB_0015c092:
  AlignFail();
}

Assistant:

const char* TcParser::MpRepeatedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  const char* ptr2 = ptr;
  uint32_t next_tag;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto& field = MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  TcParseTableBase::FieldAux aux;
  if (is_validated_enum) {
    aux = *table->field_aux(&entry);
    PrefetchEnumData(xform_val, aux);
  }

  do {
    uint64_t tmp;
    ptr = ParseVarint(ptr2, &tmp);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (is_validated_enum) {
      if (!EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux)) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = sizeof(FieldType) == 8 ? WireFormatLite::ZigZagDecode64(tmp)
                                   : WireFormatLite::ZigZagDecode32(tmp);
    }
    field.Add(static_cast<FieldType>(tmp));
    if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);

parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}